

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O0

void __thiscall
tcu::TestHierarchyIterator::TestHierarchyIterator
          (TestHierarchyIterator *this,TestPackageRoot *rootNode,TestHierarchyInflater *inflater,
          CaseListFilter *caseListFilter)

{
  undefined1 local_50 [8];
  NodeIter iter;
  CaseListFilter *caseListFilter_local;
  TestHierarchyInflater *inflater_local;
  TestPackageRoot *rootNode_local;
  TestHierarchyIterator *this_local;
  
  this->m_inflater = inflater;
  this->m_caseListFilter = caseListFilter;
  iter._32_8_ = caseListFilter;
  std::
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ::vector(&this->m_sessionStack);
  std::__cxx11::string::string((string *)&this->m_nodePath);
  NodeIter::NodeIter((NodeIter *)local_50,&rootNode->super_TestNode);
  NodeIter::setState((NodeIter *)local_50,STATE_ENTER);
  std::
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ::push_back(&this->m_sessionStack,(value_type *)local_50);
  next(this);
  NodeIter::~NodeIter((NodeIter *)local_50);
  return;
}

Assistant:

TestHierarchyIterator::TestHierarchyIterator (TestPackageRoot&			rootNode,
											  TestHierarchyInflater&	inflater,
											  const CaseListFilter&		caseListFilter)
	: m_inflater		(inflater)
	, m_caseListFilter	(caseListFilter)
{
	// Init traverse state and "seek" to first reportable node.
	NodeIter iter(&rootNode);
	iter.setState(NodeIter::STATE_ENTER); // Root is never reported
	m_sessionStack.push_back(iter);
	next();
}